

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitNTest_random_vector_Test<char8_t>::TestBody
          (WordSplitNTest_random_vector_Test<char8_t> *this)

{
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
  split_result;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> data;
  unsigned_long local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  pointer local_d0;
  long *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  container_type_conflict10 local_b8;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_a0;
  
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::RandomWordTestData
            (&local_a0,'\0',0,0);
  jessilib::
  word_split_n<std::vector,_std::vector<char8_t,_std::allocator<char8_t>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,___gnu_cxx::__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>,_char8_t>
            (&local_b8,
             (__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>)
             local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>)
             local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
             super__Vector_impl_data._M_finish,'\0',4);
  local_c8 = (long *)(((long)local_b8.
                             super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_e8 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e0,"split_result.size()","n + 1",(unsigned_long *)&local_c8,&local_e8
            );
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_c8 != (long *)0x0) {
      (**(code **)(*local_c8 + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  lVar2 = 0;
  do {
    testing::internal::
    CmpHelperEQ<std::vector<char8_t,std::allocator<char8_t>>,std::vector<char8_t,std::allocator<char8_t>>>
              ((internal *)local_e0,"split_result[index]","data.m_tokens[index]",
               (vector<char8_t,_std::allocator<char8_t>_> *)
               ((long)&((local_b8.
                         super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2),
               (vector<char8_t,_std::allocator<char8_t>_> *)
               ((long)&((local_a0.m_tokens.
                         super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      pcVar3 = "";
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
                 ,0xb5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_c8 != (long *)0x0) {
        (**(code **)(*local_c8 + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::get_remainder
            ((vector<char8_t,_std::allocator<char8_t>_> *)local_e0,&local_a0,4);
  testing::internal::
  CmpHelperEQ<std::vector<char8_t,std::allocator<char8_t>>,std::vector<char8_t,std::allocator<char8_t>>>
            ((internal *)&local_c8,"split_result[n]","data.get_remainder(n)",
             local_b8.
             super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,
             (vector<char8_t,_std::allocator<char8_t>_> *)local_e0);
  pvVar1 = (void *)CONCAT71(local_e0._1_7_,local_e0[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_d0 - (long)pvVar1);
  }
  if (local_c8._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)CONCAT71(local_e0._1_7_,local_e0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_e0._1_7_,local_e0[0]) + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::
  vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_b8);
  if (local_a0.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.m_token_indexes.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.m_token_indexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
  ::~vector(&local_a0.m_tokens);
  if (local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
      super__Vector_impl_data._M_start != (char8_t *)0x0) {
    operator_delete(local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.m_str.super__Vector_base<char8_t,_std::allocator<char8_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.m_delim.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.m_delim.super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.m_delim.super__Vector_base<char8_t,_std::allocator<char8_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.m_delim.super__Vector_base<char8_t,_std::allocator<char8_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitNTest, random_vector) {
	RandomWordTestData<TypeParam, std::vector<TypeParam>> data{};
	constexpr size_t n = 4;
	std::vector<std::vector<TypeParam>> split_result = word_split_n<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}